

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::Jacobian
          (TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *this,TPZFMatrix<double> *coord,TPZVec<double> *par
          ,TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv)

{
  TPZGeoEl *pTVar1;
  TPZGeoMesh *gmesh;
  bool bVar2;
  int iVar3;
  int c;
  long lVar4;
  long lVar5;
  int b;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int a_1;
  int iVar9;
  int a;
  ulong uVar10;
  double dVar11;
  TPZGeoElSide neighbyside;
  TPZFNMatrix<9,_double> Inv;
  REAL Det;
  TPZStack<int,_10> LowNodeSides;
  TPZManVector<double,_3> NeighPar;
  TPZManVector<double,_3> DblendTemp;
  TPZManVector<double,_3> Xside;
  TPZStack<int,_10> LowAllSides;
  TPZFNMatrix<9,_double> JacTemp;
  TPZManVector<double,_10> SidesCounter;
  TPZManVector<double,_3> XNode;
  TPZManVector<double,_3> SidePar;
  TPZFNMatrix<24,_double> Dblend;
  TPZFNMatrix<24,_double> blend;
  TPZManVector<double,_10> parChanged;
  double local_b10;
  TPZGeoElSide local_ac8;
  TPZFMatrix<double> local_ab0;
  double local_a20 [10];
  REAL local_9d0;
  TPZManVector<int,_10> local_9c8;
  TPZManVector<double,_3> local_980;
  TPZManVector<double,_3> local_948;
  TPZManVector<double,_3> local_910;
  TPZManVector<int,_10> local_8d8;
  TPZFMatrix<double> local_890;
  double local_800 [10];
  TPZFMatrix<double> local_7b0;
  double local_720 [10];
  TPZManVector<double,_10> local_6d0;
  TPZManVector<double,_3> local_660;
  TPZManVector<double,_3> local_628;
  TPZFMatrix<double> local_5f0;
  double local_560 [25];
  TPZFMatrix<double> local_498;
  double local_408 [25];
  TPZManVector<double,_10> local_340;
  TPZFMatrix<double> local_2d0;
  double local_240 [10];
  TPZFMatrix<double> local_1f0;
  double local_160 [10];
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  pTVar1 = this->fGeoEl;
  TPZManVector<double,_3>::TPZManVector(&local_980,0);
  TPZManVector<double,_3>::TPZManVector(&local_628,0);
  local_498.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_910,3,(double *)&local_498);
  local_498.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_660,3,(double *)&local_498);
  local_498.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_10>::TPZManVector(&local_6d0,0xf,(double *)&local_498);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_9c8);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_8d8);
  local_498.fElem = local_408;
  local_498.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 4;
  local_498.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_498.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_498.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_498.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018acc10;
  local_498.fSize = 0x18;
  local_498.fGiven = local_498.fElem;
  TPZVec<int>::TPZVec(&local_498.fPivot.super_TPZVec<int>,0);
  local_498.fPivot.super_TPZVec<int>.fStore = local_498.fPivot.fExtAlloc;
  local_498.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_498.fPivot.super_TPZVec<int>.fNElements = 0;
  local_498.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_498.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_498.fWork.fStore = (double *)0x0;
  local_498.fWork.fNElements = 0;
  local_498.fWork.fNAlloc = 0;
  local_498.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018ac920;
  local_5f0.fElem = local_560;
  local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018acc10;
  local_5f0.fSize = 0x18;
  local_5f0.fGiven = local_5f0.fElem;
  TPZVec<int>::TPZVec(&local_5f0.fPivot.super_TPZVec<int>,0);
  local_5f0.fPivot.super_TPZVec<int>.fStore = local_5f0.fPivot.fExtAlloc;
  local_5f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_5f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_5f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_5f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_5f0.fWork.fStore = (double *)0x0;
  local_5f0.fWork.fNElements = 0;
  local_5f0.fWork.fNAlloc = 0;
  local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018ac920;
  pztopology::TPZTetrahedron::TShape<double>(par,&local_498,&local_5f0);
  local_7b0.fElem = local_720;
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_7b0.fSize = 9;
  local_7b0.fGiven = local_7b0.fElem;
  TPZVec<int>::TPZVec(&local_7b0.fPivot.super_TPZVec<int>,0);
  local_7b0.fPivot.super_TPZVec<int>.fStore = local_7b0.fPivot.fExtAlloc;
  local_7b0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_7b0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_7b0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_7b0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_7b0.fWork.fStore = (double *)0x0;
  local_7b0.fWork.fNElements = 0;
  local_7b0.fWork.fNAlloc = 0;
  local_7b0.fElem = (double *)0x0;
  local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.fElem = (double *)0x0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_1f0.fElem = local_160;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_1f0.fSize = 9;
  local_1f0.fGiven = local_1f0.fElem;
  TPZVec<int>::TPZVec(&local_1f0.fPivot.super_TPZVec<int>,0);
  local_1f0.fPivot.super_TPZVec<int>.fStore = local_1f0.fPivot.fExtAlloc;
  local_1f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1f0.fWork.fStore = (double *)0x0;
  local_1f0.fWork.fNElements = 0;
  local_1f0.fWork.fNAlloc = 0;
  local_1f0.fElem = (double *)0x0;
  local_1f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  local_890.fElem = local_800;
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_890.fSize = 9;
  local_890.fGiven = local_890.fElem;
  TPZVec<int>::TPZVec(&local_890.fPivot.super_TPZVec<int>,0);
  local_890.fPivot.super_TPZVec<int>.fStore = local_890.fPivot.fExtAlloc;
  local_890.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_890.fPivot.super_TPZVec<int>.fNElements = 0;
  local_890.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_890.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_890.fWork.fStore = (double *)0x0;
  local_890.fWork.fNElements = 0;
  local_890.fWork.fNAlloc = 0;
  local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::operator=(&local_890,0.0);
  local_2d0.fElem = local_240;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_2d0.fSize = 9;
  local_2d0.fGiven = local_2d0.fElem;
  TPZVec<int>::TPZVec(&local_2d0.fPivot.super_TPZVec<int>,0);
  local_2d0.fPivot.super_TPZVec<int>.fStore = local_2d0.fPivot.fExtAlloc;
  local_2d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_2d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_2d0.fWork.fStore = (double *)0x0;
  local_2d0.fWork.fNElements = 0;
  local_2d0.fWork.fNAlloc = 0;
  local_2d0.fElem = (double *)0x0;
  local_2d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  gmesh = pTVar1->fMesh;
  uVar10 = 0xe;
  do {
    iVar9 = (int)uVar10;
    Neighbour(&local_ac8,this,iVar9,gmesh);
    if ((local_ac8.fGeoEl != (TPZGeoEl *)0x0) && (-1 < local_ac8.fSide)) {
      pztopology::TPZTetrahedron::LowerDimensionSides(iVar9,(TPZStack<int,_10> *)&local_9c8,0);
      pztopology::TPZTetrahedron::LowerDimensionSides(iVar9,(TPZStack<int,_10> *)&local_8d8);
      Neighbour((TPZGeoElSide *)&local_ab0,this,iVar9,gmesh);
      iVar3 = TPZGeoElSide::Dimension((TPZGeoElSide *)&local_ab0);
      lVar6 = (long)iVar3;
      local_ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183dbe0;
      local_ab0.fSize = 9;
      local_ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar6;
      local_ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar6;
      local_ab0.fElem = local_a20;
      local_ab0.fGiven = local_a20;
      TPZVec<int>::TPZVec(&local_ab0.fPivot.super_TPZVec<int>,0);
      local_ab0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_ab0.fPivot.super_TPZVec<int>.fStore = local_ab0.fPivot.fExtAlloc;
      local_ab0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_ab0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_ab0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_ab0.fWork.fStore = (double *)0x0;
      local_ab0.fWork.fNElements = 0;
      local_ab0.fWork.fNAlloc = 0;
      if (iVar3 == 0) {
        local_ab0.fElem = (double *)0x0;
      }
      else {
        uVar7 = lVar6 * lVar6;
        if (9 < uVar7) {
          local_ab0.fElem = (double *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
        }
      }
      local_ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
      iVar3 = TPZGeoElSide::Dimension(&local_ac8);
      bVar2 = MapToNeighSide<double>
                        (this,iVar9,iVar3,par,&local_980.super_TPZVec<double>,&local_2d0);
      if (bVar2) {
        Neighbour((TPZGeoElSide *)&local_340,this,iVar9,gmesh);
        TPZGeoElSide::X((TPZGeoElSide *)&local_340,&local_980.super_TPZVec<double>,
                        &local_910.super_TPZVec<double>);
        Neighbour((TPZGeoElSide *)&local_340,this,iVar9,gmesh);
        TPZGeoElSide::Jacobian
                  ((TPZGeoElSide *)&local_340,&local_980.super_TPZVec<double>,&local_7b0,&local_1f0,
                   &local_9d0,&local_ab0);
        TPZFMatrix<double>::Transpose(&local_1f0);
        TPZMatrix<double>::Multiply(&local_1f0.super_TPZMatrix<double>,&local_7b0,&local_110,0);
        TPZMatrix<double>::Multiply(&local_110.super_TPZMatrix<double>,&local_2d0,&local_7b0,0);
        local_340.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
        TPZManVector<double,_3>::TPZManVector(&local_948,3,(double *)&local_340);
        if (local_9c8.super_TPZVec<int>.fNElements < 1) {
          local_b10 = 0.0;
        }
        else {
          local_b10 = 0.0;
          lVar6 = 0;
          do {
            TPZManVector<double,_10>::TPZManVector(&local_340,par->fNElements);
            pztopology::TPZTetrahedron::TShape<double>
                      (&local_340.super_TPZVec<double>,&local_498,&local_5f0);
            lVar4 = (long)local_9c8.super_TPZVec<int>.fStore[lVar6];
            if (((lVar4 < 0) ||
                (local_498.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar4)) ||
               (local_498.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_b10 = local_b10 + local_498.fElem[lVar4];
            lVar4 = 0;
            do {
              iVar9 = local_9c8.super_TPZVec<int>.fStore[lVar6];
              if (((local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar4) ||
                  (iVar9 < 0)) ||
                 (local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= iVar9)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_948.super_TPZVec<double>.fStore[lVar4] =
                   local_5f0.fElem
                   [iVar9 * local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar4] +
                   local_948.super_TPZVec<double>.fStore[lVar4];
              lVar4 = lVar4 + 1;
            } while (lVar4 != 3);
            TPZManVector<double,_10>::~TPZManVector(&local_340);
            lVar6 = lVar6 + 1;
          } while (lVar6 < local_9c8.super_TPZVec<int>.fNElements);
        }
        lVar6 = 0;
        do {
          lVar4 = 0;
          do {
            if ((local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
               (local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
               (local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_890.fElem
            [local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4 + lVar6] =
                 (1.0 - local_6d0.super_TPZVec<double>.fStore[uVar10]) *
                 (local_7b0.fElem
                  [local_7b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4 + lVar6] *
                  local_b10 +
                 local_910.super_TPZVec<double>.fStore[lVar6] *
                 local_948.super_TPZVec<double>.fStore[lVar4]) +
                 local_890.fElem
                 [local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar4 + lVar6];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        if (0 < local_8d8.super_TPZVec<int>.fNElements) {
          lVar6 = 0;
          do {
            local_6d0.super_TPZVec<double>.fStore[local_8d8.super_TPZVec<int>.fStore[lVar6]] =
                 (1.0 - local_6d0.super_TPZVec<double>.fStore[uVar10]) +
                 local_6d0.super_TPZVec<double>.fStore[local_8d8.super_TPZVec<int>.fStore[lVar6]];
            lVar6 = lVar6 + 1;
          } while (local_8d8.super_TPZVec<int>.fNElements != lVar6);
        }
        TPZManVector<double,_3>::~TPZManVector(&local_948);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_ab0,&PTR_PTR_0183dba8);
    }
    bVar2 = 4 < uVar10;
    uVar10 = uVar10 - 1;
  } while (bVar2);
  lVar6 = 0;
  lVar4 = 0;
  do {
    lVar8 = 0;
    do {
      lVar5 = 0;
      do {
        if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) ||
           ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
           (local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
           (local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_890.fElem[local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 + lVar8]
             = (1.0 - local_6d0.super_TPZVec<double>.fStore[lVar4]) *
               coord->fElem
               [(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar4 + lVar8] *
               *(double *)
                ((long)local_5f0.fElem +
                lVar5 * 8 + local_5f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6) +
               local_890.fElem
               [local_890.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 + lVar8];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar4 = lVar4 + 1;
    lVar6 = lVar6 + 8;
  } while (lVar4 != 4);
  TPZFMatrix<double>::operator=(jacobian,&local_890);
  (*(axes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (axes,3,3);
  (*(axes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (axes);
  (*(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (jacinv,(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
             (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  if (((axes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((axes->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *axes->fElem = 1.0;
  if (((axes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((axes->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (axes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  axes->fElem[lVar6 + 1] = 1.0;
  if ((lVar6 < 3) || ((axes->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  axes->fElem[(axes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 2] = 1.0;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *detjac = jacobian->fElem[lVar4 + 1] * -jacobian->fElem[lVar6 * 2] * jacobian->fElem[2];
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *detjac = jacobian->fElem[lVar6] * jacobian->fElem[lVar4 * 2 + 1] * jacobian->fElem[2] + *detjac;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  *detjac = jacobian->fElem[lVar6 * 2] * jacobian->fElem[1] * jacobian->fElem[lVar4 + 2] + *detjac;
  if ((lVar4 < 1) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  *detjac = *detjac - jacobian->fElem[lVar6 * 2 + 1] * *jacobian->fElem * jacobian->fElem[lVar4 + 2]
  ;
  if ((lVar4 < 1) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  *detjac = *detjac - jacobian->fElem[1] * jacobian->fElem[lVar6] * jacobian->fElem[lVar4 * 2 + 2];
  if ((lVar4 < 1) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  dVar11 = *jacobian->fElem * jacobian->fElem[lVar6 + 1] * jacobian->fElem[lVar4 * 2 + 2] + *detjac;
  uVar10 = -(ulong)(ABS(dVar11) < 1e-12);
  *detjac = (REAL)(uVar10 & 0x3d719799812dea11 | ~uVar10 & (ulong)dVar11);
  if ((lVar4 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar8 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar8 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *jacinv->fElem =
       (-jacobian->fElem[lVar6 * 2 + 1] * jacobian->fElem[lVar4 + 2] +
       jacobian->fElem[lVar8 + 1] *
       jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 2]) /
       *detjac;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 1) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar8 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar8 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  jacinv->fElem[(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow] =
       (jacobian->fElem[lVar6 * 2] * jacobian->fElem[lVar4 + 2] -
       jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 2] *
       jacobian->fElem[lVar8]) / *detjac;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar4 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 1) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar8 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar8 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  jacinv->fElem[(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2] =
       (-jacobian->fElem[lVar6 * 2] * jacobian->fElem[lVar4 + 1] +
       jacobian->fElem[lVar8] *
       jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 1]) /
       *detjac;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  jacinv->fElem[1] =
       (jacobian->fElem[lVar6 * 2 + 1] * jacobian->fElem[2] -
       jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 2] *
       jacobian->fElem[1]) / *detjac;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  jacinv->fElem[(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1] =
       (-jacobian->fElem[lVar6 * 2] * jacobian->fElem[2] +
       *jacobian->fElem *
       jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 2]) /
       *detjac;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  jacinv->fElem[(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 1] =
       (jacobian->fElem[lVar6 * 2] * jacobian->fElem[1] -
       jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 1] *
       *jacobian->fElem) / *detjac;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  jacinv->fElem[2] =
       (-jacobian->fElem[lVar6 + 1] * jacobian->fElem[2] +
       jacobian->fElem[1] *
       jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 2]) / *detjac;
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar6 < 3) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  jacinv->fElem[(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 2] =
       (jacobian->fElem[lVar6] * jacobian->fElem[2] -
       jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 2] *
       *jacobian->fElem) / *detjac;
  if ((0 < (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
     (1 < (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar6 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((1 < (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
       (1 < (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      if ((2 < (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
         (2 < (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
        jacinv->fElem[(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 2] =
             (*jacobian->fElem *
              jacobian->fElem[(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1] -
             jacobian->fElem[lVar6] * jacobian->fElem[1]) / *detjac;
        TPZFMatrix<double>::~TPZFMatrix(&local_2d0,&PTR_PTR_0183dba8);
        TPZFMatrix<double>::~TPZFMatrix(&local_890,&PTR_PTR_0183dba8);
        TPZFMatrix<double>::~TPZFMatrix(&local_1f0,&PTR_PTR_0183dba8);
        TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_0183dba8);
        TPZFMatrix<double>::~TPZFMatrix(&local_7b0,&PTR_PTR_0183dba8);
        TPZFMatrix<double>::~TPZFMatrix(&local_5f0,&PTR_PTR_018acbd8);
        TPZFMatrix<double>::~TPZFMatrix(&local_498,&PTR_PTR_018acbd8);
        TPZManVector<int,_10>::~TPZManVector(&local_8d8);
        TPZManVector<int,_10>::~TPZManVector(&local_9c8);
        TPZManVector<double,_10>::~TPZManVector(&local_6d0);
        TPZManVector<double,_3>::~TPZManVector(&local_660);
        TPZManVector<double,_3>::~TPZManVector(&local_910);
        TPZManVector<double,_3>::~TPZManVector(&local_628);
        TPZManVector<double,_3>::~TPZManVector(&local_980);
        return;
      }
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Jacobian(TPZFMatrix<REAL> &coord, TPZVec<REAL>& par, TPZFMatrix<REAL> &jacobian, TPZFMatrix<REAL> &axes,REAL &detjac,TPZFMatrix<REAL> &jacinv) const
{

    TPZGeoEl &gel = *fGeoEl;
    TPZManVector<REAL,3> NeighPar, SidePar, Xside(3,0.), XNode(3,0.);
    int majorSide = TGeo::NSides - 1;
	
    TPZManVector<REAL> SidesCounter(TGeo::NSides,0);
    TPZStack<int> LowNodeSides, LowAllSides;
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "input parameter par " << par;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    TPZFNMatrix<24> blend(TGeo::NNodes,1), Dblend(TGeo::Dimension,TGeo::NNodes);
    TGeo::Shape(par,blend,Dblend);
	
    TPZFNMatrix<9> J1, J2, Ax, JacTemp(3,TGeo::Dimension, 0.), Jneighbourhood;
    REAL Det;
    TPZGeoMesh *gmesh = gel.Mesh();
    for(int byside = majorSide; byside >= TGeo::NNodes; byside--)
    {
        TPZGeoElSide neighbyside = Neighbour(byside, gmesh);
        if(neighbyside.Exists())
        {
            TGeo::LowerDimensionSides(byside,LowNodeSides,0);
            TGeo::LowerDimensionSides(byside,LowAllSides);
            int dim = Neighbour(byside, gmesh).Dimension();
            TPZFNMatrix<9> Inv(dim,dim);
            int sidedim = neighbyside.Dimension();
            if(!MapToNeighSide(byside,sidedim,par,NeighPar, Jneighbourhood))
			{
				continue;
			}
            Neighbour(byside,gmesh).X(NeighPar,Xside);
            Neighbour(byside,gmesh).Jacobian(NeighPar,J1,Ax,Det,Inv);
            Ax.Transpose(); 
            Ax.Multiply(J1,J2);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "byside " << byside << std::endl;
        		sout << "side of the neighbour " << Neighbour(byside,gmesh).Side() << std::endl;
        		Neighbour(byside,gmesh).Element()->Print(sout);
				sout << "neighbour parameter(NeighPar) " << NeighPar << std::endl;
				sout << "Jacobian of the map(Jneighborhood) " << Jneighbourhood << std::endl;
				sout << "Xside " << Xside << std::endl;
				sout << "jacobian neighbour(J1) " << J1 << std::endl;
        		Ax.Print("Ax of the neighbour (Ax) ",sout);
				sout << "jacobian of the neighbour multiplied by the axes(J2) " << J2 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            J2.Multiply(Jneighbourhood,J1);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "acumulated jacobian(J1) " << J1 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            REAL blendTemp = 0.; 
            TPZManVector<REAL,3> DblendTemp(TGeo::Dimension,0.);
            for(int a = 0; a < LowNodeSides.NElements(); a++)
            {
                TPZManVector<REAL> parChanged(par.NElements());
                TGeo::Shape(parChanged,blend,Dblend);
				
                blendTemp += blend(LowNodeSides[a],0);
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    DblendTemp[b] += Dblend(b,LowNodeSides[a]);
                }
            }
			
            for(int a = 0; a < 3; a++)
            {
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    JacTemp(a,b) += (1 - SidesCounter[byside]) * (J1(a,b)*blendTemp + Xside[a]*DblendTemp[b]);
                }
            }
            for(int a = 0; a < LowAllSides.NElements(); a++) 
            {
                SidesCounter[LowAllSides[a]] += (1 - SidesCounter[byside]);
            }
        }
    }
	
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		JacTemp.Print("Jabobian before contributing the nodes",sout);
		sout << "SidesCounter " << SidesCounter << std::endl;
		sout << "DBlend " << Dblend << std::endl;
		sout << "NodeCoord " << coord << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    for(int a = 0; a < TGeo::NNodes; a++)
    {
        for(int b = 0; b < 3; b++) 
        { 
            for(int c = 0; c < TGeo::Dimension; c++)
            {
            	JacTemp(b,c) += (1 - SidesCounter[a]) * coord(b,a)*Dblend(c,a);
            }
        }
    }
	
    if(TGeo::Dimension == 1)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        detjac = jacobian(0,0);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) = 1./detjac;
    } else if(TGeo::Dimension == 2)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        detjac = jacobian(0,0)*jacobian(1,1) - jacobian(1,0)*jacobian(0,1);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) =  jacobian(1,1) / detjac;
        jacinv(1,1) =  jacobian(0,0) / detjac;
        jacinv(0,1) = -jacobian(0,1) / detjac;
        jacinv(1,0) = -jacobian(1,0) / detjac;
    }
    else
    {
        jacobian = JacTemp;
        axes.Resize(3,3); axes.Zero();
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        axes(0,0) = 1.; axes(1,1) = 1.; axes(2,2) = 1.;
        detjac = -jacobian(0,2)*jacobian(1,1)*jacobian(2,0);//- a02 a11 a20
        detjac += jacobian(0,1)*jacobian(1,2)*jacobian(2,0);//+ a01 a12 a20
        detjac += jacobian(0,2)*jacobian(1,0)*jacobian(2,1);//+ a02 a10 a21
        detjac -= jacobian(0,0)*jacobian(1,2)*jacobian(2,1);//- a00 a12 a21
        detjac -= jacobian(0,1)*jacobian(1,0)*jacobian(2,2);//- a01 a10 a22
        detjac += jacobian(0,0)*jacobian(1,1)*jacobian(2,2);//+ a00 a11 a22
        
        if(IsZero(detjac))
		{
#ifdef PZ_LOG
            if(logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Singular Jacobian " << detjac;
                LOGPZ_ERROR(logger, sout.str())
            }
#endif
			detjac = ZeroTolerance();
		}
        
        jacinv(0,0) = (-jacobian(1,2)*jacobian(2,1)+jacobian(1,1)*jacobian(2,2)) / detjac;//-a12 a21 + a11 a22
        jacinv(0,1) = ( jacobian(0,2)*jacobian(2,1)-jacobian(0,1)*jacobian(2,2)) / detjac;// a02 a21 - a01 a22
        jacinv(0,2) = (-jacobian(0,2)*jacobian(1,1)+jacobian(0,1)*jacobian(1,2)) / detjac;//-a02 a11 + a01 a12
        jacinv(1,0) = ( jacobian(1,2)*jacobian(2,0)-jacobian(1,0)*jacobian(2,2)) / detjac;// a12 a20 - a10 a22
        jacinv(1,1) = (-jacobian(0,2)*jacobian(2,0)+jacobian(0,0)*jacobian(2,2)) / detjac;//-a02 a20 + a00 a22
        jacinv(1,2) = ( jacobian(0,2)*jacobian(1,0)-jacobian(0,0)*jacobian(1,2)) / detjac;// a02 a10 - a00 a12
        jacinv(2,0) = (-jacobian(1,1)*jacobian(2,0)+jacobian(1,0)*jacobian(2,1)) / detjac;//-a11 a20 + a10 a21
        jacinv(2,1) = ( jacobian(0,1)*jacobian(2,0)-jacobian(0,0)*jacobian(2,1)) / detjac;// a01 a20 - a00 a21
        jacinv(2,2) = (-jacobian(0,1)*jacobian(1,0)+jacobian(0,0)*jacobian(1,1)) / detjac;//-a01 a10 + a00 a11
    }
}